

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::ShaderSubroutine::NegativeTest2::iterate(NegativeTest2 *this)

{
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  _shader_stage local_50;
  _shader_stage local_4c;
  undefined1 local_45;
  int referencing_stage;
  allocator<char> local_31;
  string local_30;
  NegativeTest2 *local_10;
  NegativeTest2 *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    local_45 = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_shader_subroutine is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    local_45 = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  for (local_4c = SHADER_STAGE_FIRST; (int)local_4c < 5;
      local_4c = local_4c + SHADER_STAGE_TESSELLATION_CONTROL) {
    local_50 = local_4c;
    executeTestCase(this,&local_50);
  }
  if ((this->m_has_test_passed & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult NegativeTest2::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Iterate over all shader stages and execute the checks */
	for (int referencing_stage = static_cast<int>(Utils::SHADER_STAGE_FIRST);
		 referencing_stage < static_cast<int>(Utils::SHADER_STAGE_COUNT); ++referencing_stage)
	{
		executeTestCase(static_cast<Utils::_shader_stage>(referencing_stage));
	} /* for (all test cases) */

	/* All done */
	if (m_has_test_passed)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}